

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::checkProgramResourceiv
          (FunctionalTest3_4 *this,GLuint program_id,GLenum program_interface,GLenum pname,
          GLchar *resource_name,GLint expected)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  GLchar *local_1e8;
  GLchar *local_1e0 [3];
  MessageBuilder local_1c8;
  int local_48;
  int local_44;
  GLint value;
  GLuint index;
  Functions *gl;
  GLchar *pGStack_30;
  GLint expected_local;
  GLchar *resource_name_local;
  GLenum local_20;
  GLenum pname_local;
  GLenum program_interface_local;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  
  gl._4_4_ = expected;
  pGStack_30 = resource_name;
  resource_name_local._4_4_ = pname;
  local_20 = program_interface;
  pname_local = program_id;
  _program_interface_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _value = CONCAT44(extraout_var,iVar1);
  local_44 = (**(code **)(_value + 0x9a8))(pname_local,local_20,pGStack_30);
  local_48 = 0;
  if (local_44 == -1) {
    this_local._7_1_ = false;
  }
  else {
    (**(code **)(_value + 0x9c8))
              (pname_local,local_20,local_44,1,(long)&resource_name_local + 4,1,0,&local_48);
    err = (**(code **)(_value + 0x800))();
    glu::checkError(err,"getProgramResourceiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xc12);
    if (gl._4_4_ == local_48) {
      this_local._7_1_ = true;
    }
    else {
      this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<(&local_1c8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_1c8,
                          (char (*) [56])"Error. Invalid result. Function: getProgramResourceiv. ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])"Program interface: ");
      local_1e0[0] = Utils::programInterfaceToStr(local_20);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1e0);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b17bfb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"Resource name: ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xffffffffffffffd0);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b17bfb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])"Property: ");
      local_1e8 = Utils::pnameToStr(resource_name_local._4_4_);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1e8);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b17bfb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])0x2a1a406);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_48);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b17bfb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])0x2b01f60);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&gl + 4));
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b6cb9a);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c8);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionalTest3_4::checkProgramResourceiv(GLuint program_id, GLenum program_interface, GLenum pname,
											   const glw::GLchar* resource_name, GLint expected) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLuint				  index = gl.getProgramResourceIndex(program_id, program_interface, resource_name);
	GLint				  value = 0;

	if (GL_INVALID_INDEX == index)
	{
		return false;
	}

	gl.getProgramResourceiv(program_id, program_interface, index, 1, &pname, 1, 0, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramResourceiv");

	if (expected != value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error. Invalid result. Function: getProgramResourceiv. "
			<< "Program interface: " << Utils::programInterfaceToStr(program_interface) << ". "
			<< "Resource name: " << resource_name << ". "
			<< "Property: " << Utils::pnameToStr(pname) << ". "
			<< "Result: " << value << ". "
			<< "Expected: " << expected << "." << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		return true;
	}
}